

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rlib::midi::EventMeta::midiMessage
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          EventMeta *this)

{
  move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  __first;
  initializer_list<unsigned_char> __l;
  allocator_type local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> s;
  
  s.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xff;
  s.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = (undefined1)this->type;
  __l._M_len = 2;
  __l._M_array = (iterator)&s;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__l,&local_29);
  inner::getVariableValue
            (&s,(long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  __first._M_current._M_current._1_1_ =
       s.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._1_1_;
  __first._M_current._M_current._0_1_ =
       s.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  __first._M_current._M_current._2_6_ =
       s.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._2_6_;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (const_iterator)
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,__first,
             (move_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )s.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&s.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (const_iterator)
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> midiMessage() const {
			std::vector<uint8_t> v{
				statusByte,
				static_cast<uint8_t>(type),
			};
			{// データサイズ
				std::vector<uint8_t> s = inner::getVariableValue(data.size());
				v.insert(v.end(), std::make_move_iterator(s.begin()), std::make_move_iterator(s.end()));
			}
			v.insert(v.end(), data.begin(), data.end());	// データ
			return v;
		}